

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O0

void __thiscall VmaJsonWriter::ContinueString(VmaJsonWriter *this,char *pStr)

{
  char cVar1;
  VmaStringBuilder *pVVar2;
  char *in_RSI;
  VmaStringBuilder *in_RDI;
  char ch;
  size_t i;
  size_t strLen;
  ulong in_stack_ffffffffffffffc8;
  undefined7 in_stack_ffffffffffffffd8;
  VmaStringBuilder *this_00;
  
  pVVar2 = (VmaStringBuilder *)strlen(in_RSI);
  for (this_00 = (VmaStringBuilder *)0x0; this_00 < pVVar2;
      this_00 = (VmaStringBuilder *)((long)&(this_00->m_Data).m_Allocator.m_pCallbacks + 1)) {
    cVar1 = in_RSI[(long)this_00];
    if (cVar1 == '\\') {
      VmaStringBuilder::Add(this_00,(char *)CONCAT17(0x5c,in_stack_ffffffffffffffd8));
    }
    else if (cVar1 == '\"') {
      VmaStringBuilder::Add(this_00,(char *)CONCAT17(0x22,in_stack_ffffffffffffffd8));
    }
    else if (cVar1 < ' ') {
      in_stack_ffffffffffffffc8 = (ulong)((int)cVar1 - 8);
      switch(in_stack_ffffffffffffffc8) {
      case 0:
        VmaStringBuilder::Add(this_00,(char *)CONCAT17(cVar1,in_stack_ffffffffffffffd8));
        break;
      case 1:
        VmaStringBuilder::Add(this_00,(char *)CONCAT17(cVar1,in_stack_ffffffffffffffd8));
        break;
      case 2:
        VmaStringBuilder::Add(this_00,(char *)CONCAT17(cVar1,in_stack_ffffffffffffffd8));
        break;
      default:
        break;
      case 4:
        VmaStringBuilder::Add(this_00,(char *)CONCAT17(cVar1,in_stack_ffffffffffffffd8));
        break;
      case 5:
        VmaStringBuilder::Add(this_00,(char *)CONCAT17(cVar1,in_stack_ffffffffffffffd8));
      }
    }
    else {
      VmaStringBuilder::Add(in_RDI,(char)(in_stack_ffffffffffffffc8 >> 0x38));
    }
  }
  return;
}

Assistant:

void VmaJsonWriter::ContinueString(const char* pStr)
{
    VMA_ASSERT(m_InsideString);

    const size_t strLen = strlen(pStr);
    for (size_t i = 0; i < strLen; ++i)
    {
        char ch = pStr[i];
        if (ch == '\\')
        {
            m_SB.Add("\\\\");
        }
        else if (ch == '"')
        {
            m_SB.Add("\\\"");
        }
        else if (ch >= 32)
        {
            m_SB.Add(ch);
        }
        else switch (ch)
        {
        case '\b':
            m_SB.Add("\\b");
            break;
        case '\f':
            m_SB.Add("\\f");
            break;
        case '\n':
            m_SB.Add("\\n");
            break;
        case '\r':
            m_SB.Add("\\r");
            break;
        case '\t':
            m_SB.Add("\\t");
            break;
        default:
            VMA_ASSERT(0 && "Character not currently supported.");
            break;
        }
    }
}